

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::rasterization::anon_unknown_0::
WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance>::createInstance
          (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance> *this,
          Context *context)

{
  PointTestInstance *this_00;
  Context *context_local;
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance> *this_local;
  
  this_00 = (PointTestInstance *)operator_new(0x2b0);
  PointTestInstance::PointTestInstance
            (this_00,context,this->m_wideness,(this->super_BaseRenderingTestCase).m_sampleCount);
  return (TestInstance *)this_00;
}

Assistant:

virtual TestInstance*		createInstance		(Context& context) const
								{
									return new ConcreteTestInstance(context, m_wideness, m_sampleCount);
								}